

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddTxOut
          (ConfidentialTransactionContext *this,ElementsConfidentialAddress *address,Amount *value,
          ConfidentialAssetId *asset,bool remove_nonce)

{
  uint32_t uVar1;
  Script *in_RCX;
  ConfidentialAssetId *in_RDX;
  Amount *in_RDI;
  byte in_R8B;
  ByteData nonce;
  ByteData *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ConfidentialNonce local_e0;
  ConfidentialNonce local_b8 [3];
  ByteData local_40;
  byte local_21;
  Script *local_20;
  ConfidentialAssetId *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  cfd::core::ByteData::ByteData(&local_40);
  if ((local_21 & 1) == 0) {
    cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
    cfd::core::Pubkey::GetData();
    core::ByteData::operator=
              ((ByteData *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    core::ByteData::~ByteData((ByteData *)0x407abb);
    core::Pubkey::~Pubkey((Pubkey *)0x407ac8);
  }
  cfd::core::ElementsConfidentialAddress::GetLockingScript();
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_e0,&local_40);
  uVar1 = cfd::core::ConfidentialTransaction::AddTxOut(in_RDI,local_18,local_20,local_b8);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x407b79);
  core::Script::~Script((Script *)CONCAT44(uVar1,in_stack_ffffffffffffff00));
  core::ByteData::~ByteData((ByteData *)0x407b90);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  ByteData nonce;
  if (!remove_nonce) {
    nonce = address.GetConfidentialKey().GetData();
  }
  return AddTxOut(
      value, asset, address.GetLockingScript(), ConfidentialNonce(nonce));
}